

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

RSA * RSA_parse_public_key(CBS *cbs)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_30 [8];
  CBS child;
  RSA *ret;
  CBS *cbs_local;
  
  child.len = (size_t)RSA_new();
  if ((RSA *)child.len != (RSA *)0x0) {
    iVar1 = CBS_get_asn1(cbs,(CBS *)local_30,0x20000010);
    if ((((iVar1 != 0) &&
         (iVar1 = parse_integer((CBS *)local_30,(BIGNUM **)(child.len + 8)), iVar1 != 0)) &&
        (iVar1 = parse_integer((CBS *)local_30,(BIGNUM **)(child.len + 0x10)), iVar1 != 0)) &&
       (sVar2 = CBS_len((CBS *)local_30), sVar2 == 0)) {
      iVar1 = RSA_check_key((RSA *)child.len);
      if (iVar1 != 0) {
        return (RSA *)child.len;
      }
      ERR_put_error(4,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                    ,0x41);
      RSA_free((RSA *)child.len);
      return (RSA *)0x0;
    }
    ERR_put_error(4,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                  ,0x3b);
    RSA_free((RSA *)child.len);
  }
  return (RSA *)0x0;
}

Assistant:

RSA *RSA_parse_public_key(CBS *cbs) {
  RSA *ret = RSA_new();
  if (ret == NULL) {
    return NULL;
  }
  CBS child;
  if (!CBS_get_asn1(cbs, &child, CBS_ASN1_SEQUENCE) ||
      !parse_integer(&child, &ret->n) ||
      !parse_integer(&child, &ret->e) ||
      CBS_len(&child) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    RSA_free(ret);
    return NULL;
  }

  if (!RSA_check_key(ret)) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_RSA_PARAMETERS);
    RSA_free(ret);
    return NULL;
  }

  return ret;
}